

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

void __thiscall rw::Atomic::destroy(Atomic *this)

{
  uint8 *puVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  
  PluginList::destruct((PluginList *)&s_plglist,this);
  if (this->geometry != (Geometry *)0x0) {
    Geometry::destroy(this->geometry);
  }
  if ((this->object).object.parent != (void *)0x0) {
    pLVar2 = (this->object).inFrame.next;
    pLVar3 = (this->object).inFrame.prev;
    pLVar3->next = pLVar2;
    pLVar2->prev = pLVar3;
  }
  (this->object).object.parent = (void *)0x0;
  puVar1 = &(this->object).object.privateFlags;
  *puVar1 = *puVar1 | 1;
  (*DAT_0014ada0)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Atomic::destroy(void)
{
	s_plglist.destruct(this);
	if(this->geometry)
		this->geometry->destroy();
	assert(this->clump == nil);
	assert(this->world == nil);
	this->setFrame(nil);
	rwFree(this);
	numAllocated--;
}